

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O1

PageDesc * page_find_alloc(uc_struct_conflict15 *uc,tb_page_addr_t index,int alloc)

{
  bool bVar1;
  long lVar2;
  gpointer pvVar3;
  gpointer pvVar4;
  void **ppvVar5;
  long lVar6;
  
  ppvVar5 = uc->l1_map + ((long)uc->v_l1_size - 1U & index >> ((byte)uc->v_l1_shift & 0x3f));
  lVar2 = (long)uc->v_l2_levels;
  if (0 < lVar2) {
    lVar6 = lVar2 + 1;
    lVar2 = lVar2 * 10;
    do {
      pvVar4 = *ppvVar5;
      if (pvVar4 == (gpointer)0x0) {
        if (alloc == 0) {
          pvVar4 = (gpointer)0x0;
        }
        else {
          pvVar3 = g_malloc0(0x2000);
          pvVar4 = *ppvVar5;
          if (pvVar4 == (gpointer)0x0) {
            *ppvVar5 = pvVar3;
            pvVar4 = pvVar3;
          }
          else {
            g_free(pvVar3);
          }
        }
        if (alloc != 0) goto LAB_00d23e53;
        bVar1 = false;
      }
      else {
LAB_00d23e53:
        ppvVar5 = (void **)((long)pvVar4 +
                           (ulong)((uint)(index >> ((byte)lVar2 & 0x3f)) & 0x3ff) * 8);
        bVar1 = true;
      }
      if (!bVar1) {
        return (PageDesc *)0x0;
      }
      lVar6 = lVar6 + -1;
      lVar2 = lVar2 + -10;
    } while (1 < lVar6);
  }
  pvVar4 = *ppvVar5;
  if (pvVar4 == (gpointer)0x0) {
    if (alloc == 0) {
      pvVar4 = (gpointer)0x0;
    }
    else {
      pvVar3 = g_malloc0(0x6000);
      pvVar4 = *ppvVar5;
      if (pvVar4 == (gpointer)0x0) {
        *ppvVar5 = pvVar3;
        pvVar4 = pvVar3;
      }
      else {
        g_free(pvVar3);
      }
    }
    if (alloc == 0) {
      return (PageDesc *)0x0;
    }
  }
  return (PageDesc *)((long)pvVar4 + (ulong)((uint)index & 0x3ff) * 0x18);
}

Assistant:

static PageDesc *page_find_alloc(struct uc_struct *uc, tb_page_addr_t index, int alloc)
{
    PageDesc *pd;
    void **lp;
    int i;

    /* Level 1.  Always allocated.  */
    lp = uc->l1_map + ((index >> uc->v_l1_shift) & (uc->v_l1_size - 1));

    /* Level 2..N-1.  */
    for (i = uc->v_l2_levels; i > 0; i--) {
        void **p = *lp;

        if (p == NULL) {
            void *existing;

            if (!alloc) {
                return NULL;
            }
            p = g_new0(void *, V_L2_SIZE);
            existing = *lp;
            if (*lp == NULL) {
                *lp = p;
            }
            if (unlikely(existing)) {
                g_free(p);
                p = existing;
            }
        }

        lp = p + ((index >> (i * V_L2_BITS)) & (V_L2_SIZE - 1));
    }

    pd = *lp;
    if (pd == NULL) {
        void *existing;

        if (!alloc) {
            return NULL;
        }
        pd = g_new0(PageDesc, V_L2_SIZE);
        existing = *lp;
        if (*lp == NULL) {
            *lp = pd;
        }
        if (unlikely(existing)) {
            g_free(pd);
            pd = existing;
        }
    }

    return pd + (index & (V_L2_SIZE - 1));
}